

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

void __thiscall GraphSam::deleteNode(GraphSam *this,int value)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  __shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *this_02;
  const_iterator local_30;
  __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
  local_20;
  iterator iter;
  int value_local;
  GraphSam *this_local;
  
  iter._M_current._4_4_ = value;
  local_20._M_current =
       (shared_ptr<GraphNode> *)
       std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::begin
                 (&this->m_nodes);
  while( true ) {
    local_28._M_current =
         (shared_ptr<GraphNode> *)
         std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::end
                   (&this->m_nodes);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return;
    }
    this_00 = (__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
              ::operator*(&local_20);
    this_01 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    iVar2 = GraphNode::getValue(this_01);
    if (iVar2 == iter._M_current._4_4_) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
    ::operator++(&local_20,0);
  }
  this_02 = &__gnu_cxx::
             __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
             ::operator->(&local_20)->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::reset(this_02);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<GraphNode>const*,std::vector<std::shared_ptr<GraphNode>,std::allocator<std::shared_ptr<GraphNode>>>>
  ::__normal_iterator<std::shared_ptr<GraphNode>*>
            ((__normal_iterator<std::shared_ptr<GraphNode>const*,std::vector<std::shared_ptr<GraphNode>,std::allocator<std::shared_ptr<GraphNode>>>>
              *)&local_30,&local_20);
  std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::erase
            (&this->m_nodes,local_30);
  return;
}

Assistant:

void GraphSam::deleteNode(int value) {

    for (auto iter = m_nodes.begin(); iter != m_nodes.end(); iter++) {
        if ((*iter)->getValue() == value) {
            iter->reset();
            m_nodes.erase(iter);
            return;
        }
    }

}